

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

InterpretResult __thiscall VM::run(VM *this)

{
  uint uVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>_>
  *this_00;
  char *pcVar2;
  uchar uVar3;
  long lVar4;
  pointer pbVar5;
  _Alloc_hider _Var6;
  pointer pcVar7;
  pointer pcVar8;
  Instructions *pIVar9;
  pointer __s;
  mapped_type *pmVar10;
  iterator iVar11;
  iterator iVar12;
  long *plVar13;
  undefined8 uVar14;
  pointer puVar15;
  long *plVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  value_type *__val;
  int iVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  string error;
  key_type local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  int local_54;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pIVar9 = this->instructions;
  uVar17 = this->ip;
  uVar18 = (ulong)(int)uVar17;
  puVar15 = (pIVar9->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (uVar18 < (ulong)((long)(pIVar9->code).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar15)) {
    this_00 = &this->tapes;
    do {
      paVar21 = &local_98.field_2;
      uVar1 = uVar17 + 1;
      this->ip = uVar1;
      local_98._M_dataplus._M_p = (pointer)paVar21;
      switch(puVar15[uVar18]) {
      case '\0':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,&local_98);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_0010666d:
          std::__throw_out_of_range("_Map_base::at");
LAB_00106679:
          std::__throw_out_of_range("_Map_base::at");
LAB_00106685:
          uVar14 = std::__throw_out_of_range("_Map_base::at");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          _Unwind_Resume(uVar14);
        }
        *(long *)((long)iVar11.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                        ._M_cur + 0x40) =
             *(long *)((long)iVar11.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                             ._M_cur + 0x40) + 1;
        goto LAB_0010635f;
      case '\x01':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,&local_98);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_00106655:
          std::__throw_out_of_range("_Map_base::at");
LAB_00106661:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_0010666d;
        }
        lVar4 = *(long *)((long)iVar11.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                ._M_cur + 0x40);
        if (lVar4 == 0) {
          std::operator+(&local_78,"Attempting to decrement the pointer below 0 on ",&local_98);
          plVar13 = (long *)std::__cxx11::string::append((char *)&local_78);
          local_50 = (long *)*plVar13;
          plVar16 = plVar13 + 2;
          if (local_50 == plVar16) {
            local_40 = *plVar16;
            lStack_38 = plVar13[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *plVar16;
          }
          local_48 = plVar13[1];
          *plVar13 = (long)plVar16;
          plVar13[1] = 0;
          *(undefined1 *)(plVar13 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          runtimeError(this,(char *)local_50);
          run();
        }
        else {
          *(long *)((long)iVar11.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                          ._M_cur + 0x40) = lVar4 + -1;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar21) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (lVar4 == 0) {
          return RUNTIME_ERROR;
        }
        break;
      case '\x02':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,&local_98);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00106661;
        pcVar2 = (char *)(*(long *)((long)iVar11.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                          ._M_cur + 0x28) +
                         *(long *)((long)iVar11.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                         ._M_cur + 0x40));
        *pcVar2 = *pcVar2 + '\x01';
        goto LAB_0010635f;
      case '\x03':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,&local_98);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_00106649:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_00106655;
        }
        pcVar2 = (char *)(*(long *)((long)iVar11.
                                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                          ._M_cur + 0x28) +
                         *(long *)((long)iVar11.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                         ._M_cur + 0x40));
        *pcVar2 = *pcVar2 + -1;
        goto LAB_0010635f;
      case '\x04':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,&local_98);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_0010663d:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_00106649;
        }
        local_78._M_dataplus._M_p._0_1_ =
             *(undefined1 *)
              (*(long *)((long)iVar11.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                               ._M_cur + 0x28) +
              *(long *)((long)iVar11.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                              ._M_cur + 0x40));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_78,1);
        goto LAB_0010635f;
      case '\x05':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,&local_98);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
LAB_00106631:
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_0010663d;
        }
        iVar19 = getchar();
        *(char *)(*(long *)((long)iVar11.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                  ._M_cur + 0x28) +
                 *(long *)((long)iVar11.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                 ._M_cur + 0x40)) = (char)iVar19;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar21) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        break;
      case '\x06':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,&local_98);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
          goto LAB_00106631;
        }
        uVar17 = this->ip;
        this->ip = uVar17 + 1;
        puVar15 = (this->instructions->code).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar3 = puVar15[(int)uVar17];
        this->ip = uVar17 + 2;
        if (*(char *)(*(long *)((long)iVar11.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                      ._M_cur + 0x28) +
                     *(long *)((long)iVar11.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                     ._M_cur + 0x40)) == '\0') {
          this->ip = (uint)CONCAT11(uVar3,puVar15[(int)(uVar17 + 1)]) + uVar17 + 2;
        }
LAB_0010635f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != paVar21) {
LAB_001064fc:
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        break;
      case '\a':
        this->ip = uVar17 + 3;
        uVar3 = puVar15[(int)(uVar17 + 2)];
        this->ip = uVar17 + 4;
        this->ip = (uVar17 - CONCAT11(uVar3,puVar15[(int)(uVar17 + 3)])) + 4;
        break;
      case '\b':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        __s = (pointer)operator_new(30000);
        memset(__s,0,30000);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,&local_98);
        goto LAB_001064b7;
      case '\t':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        __s = (pointer)operator_new(30000);
        memset(__s,0,30000);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,&local_98);
LAB_001064b7:
        pcVar7 = (pmVar10->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pcVar8 = (pmVar10->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        (pmVar10->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start = __s;
        (pmVar10->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish = __s + 30000;
        (pmVar10->values).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = __s + 30000;
        if (pcVar7 != (pointer)0x0) {
          operator_delete(pcVar7,(long)pcVar8 - (long)pcVar7);
        }
        pmVar10->ptr = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p == paVar21) break;
        goto LAB_001064fc;
      case '\n':
        this->ip = uVar17 + 2;
        pbVar5 = (pIVar9->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var6._M_p = pbVar5[puVar15[(int)uVar1]]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_98,_Var6._M_p,
                   _Var6._M_p + pbVar5[puVar15[(int)uVar1]]._M_string_length);
        iVar11 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&this_00->_M_h,&local_98);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
            ._M_cur == (__node_type *)0x0) goto LAB_00106679;
        iVar19 = (int)*(char *)(*(long *)((long)iVar11.
                                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                                ._M_cur + 0x28) +
                               *(long *)((long)iVar11.
                                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                               ._M_cur + 0x40));
        pbVar5 = (this->instructions->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar20 = (int)((ulong)((long)(this->instructions->names).
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) >> 5
                      );
        if (iVar19 < iVar20) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          _Var6._M_p = pbVar5[iVar19]._M_dataplus._M_p;
          local_54 = iVar19;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,_Var6._M_p,_Var6._M_p + pbVar5[iVar19]._M_string_length);
          iVar12 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&this_00->_M_h,&local_78);
          if (iVar12.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
              ._M_cur == (__node_type *)0x0) goto LAB_00106685;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          *(undefined1 *)
           (*(long *)((long)iVar11.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                            ._M_cur + 0x28) +
           *(long *)((long)iVar11.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                           ._M_cur + 0x40)) =
               *(undefined1 *)
                (*(long *)((long)iVar12.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                 ._M_cur + 0x28) +
                *(long *)((long)iVar12.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Tape>,_true>
                                ._M_cur + 0x40));
          iVar19 = local_54;
        }
        else {
          runtimeError(this,"Attempting to copy a value from a tape that does not exist.");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if (iVar20 <= iVar19) {
          return RUNTIME_ERROR;
        }
      }
      pIVar9 = this->instructions;
      uVar17 = this->ip;
      uVar18 = (ulong)(int)uVar17;
      puVar15 = (pIVar9->code).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(pIVar9->code).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar15));
  }
  return OK;
}

Assistant:

InterpretResult VM::run()
{
    auto readByte = [this]() -> uint8_t
    {
        return this->instructions.getCodeAt(this->ip++);
    };

    while (instructions.hasCodeAt(ip))
    {
#ifdef DEBUG_TRACE_EXECUTION
        instructions.disassembleInstruction(ip);
#endif

        auto instruction = OpCode(readByte());
        switch (instruction)
        {
            case OpCode::BEGIN:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                
                uint16_t offset = (readByte() << 8) | readByte();
                if (tape.values[tape.ptr] == 0) ip += offset;

                break;
            }
            case OpCode::DECATPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = tape.values[tape.ptr] - 1;

                break;
            }
            case OpCode::DECPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                if (tape.ptr == 0)
                {
                    std::string error = "Attempting to decrement the pointer below 0 on " + name + ".";
                    runtimeError(error.c_str());
                    return InterpretResult::RUNTIME_ERROR;
                }
                else
                {
                    tape.ptr--;
                }
                break;
            }
            case OpCode::DEFINE_NAME:
            {
                const auto& name = instructions.getNameAt(readByte());
                tapes[name] = Tape();
                break;
            }
            case OpCode::DELETE_NAME:
            {
                // Should actually erase the tape or something here.
                const auto& name = instructions.getNameAt(readByte());
                tapes[name] = Tape();
                break;
            }
            case OpCode::END:
            {
                readByte(); // Tape name, not required here.
                uint16_t offset = (readByte() << 8) | readByte();
                ip -= offset;
                break;
            }
            case OpCode::INCATPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = tape.values[tape.ptr] + 1;

                break;
            }
            case OpCode::INCPTR:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.ptr++;
                break;
            }
            case OpCode::INPUT:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                tape.values[tape.ptr] = getchar();
                break;
            }
            case OpCode::OUTPUT:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                std::cout << tape.values[tape.ptr];
                break;
            }
            case OpCode::COPY_FROM:
            {
                const auto& name = instructions.getNameAt(readByte());
                auto& tape = tapes.at(name);
                auto fromIdx = tape.values[tape.ptr];
                if (fromIdx >= instructions.tapeCount())
                {
                    runtimeError("Attempting to copy a value from a tape that does not exist.");
                    return InterpretResult::RUNTIME_ERROR;
                }
                else
                {
                    auto& fromTape = tapes.at(instructions.getNameAt(fromIdx));
                    tape.values[tape.ptr] = fromTape.values[fromTape.ptr];
                }
                break;
            }
        }
    }
    return InterpretResult::OK;
}